

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O0

DFsVariable * __thiscall DFsScript::FindVariable(DFsScript *this,char *name)

{
  DFsVariable *pDVar1;
  DFsScript *local_30;
  DFsScript *current;
  DFsVariable *var;
  char *name_local;
  DFsScript *this_local;
  
  local_30 = this;
  while( true ) {
    if (local_30 == (DFsScript *)0x0) {
      return (DFsVariable *)0x0;
    }
    pDVar1 = VariableForName(local_30,name);
    if (pDVar1 != (DFsVariable *)0x0) break;
    local_30 = ::TObjPtr::operator_cast_to_DFsScript_((TObjPtr *)&local_30->parent);
  }
  return pDVar1;
}

Assistant:

DFsVariable *DFsScript::FindVariable(const char *name)
{
	DFsVariable *var;
	DFsScript *current = this;
	
	while(current)
    {
		// check this script
		if ((var = current->VariableForName(name)))
			return var;
		current = current->parent;    // try the parent of this one
    }
	
	return NULL;    // no variable
}